

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

void lust_pulse(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *in_RDI;
  int skill;
  char buf [4608];
  CHAR_DATA *victim;
  OBJ_DATA *steal;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  CHAR_DATA *in_stack_ffffffffffffede0;
  undefined1 in_stack_ffffffffffffedef;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  OBJ_DATA *in_stack_ffffffffffffee00;
  CHAR_DATA *in_stack_ffffffffffffee08;
  int in_stack_ffffffffffffeecc;
  CHAR_DATA *in_stack_ffffffffffffeed0;
  int in_stack_ffffffffffffeff4;
  CHAR_DATA *in_stack_ffffffffffffeff8;
  CHAR_DATA *in_stack_fffffffffffff000;
  CHAR_DATA *local_20;
  OBJ_DATA *local_18;
  
  if ((in_RDI->fighting == (CHAR_DATA *)0x0) && (bVar1 = is_awake(in_RDI), bVar1)) {
    ch_00 = in_RDI;
    skill_lookup((char *)in_stack_ffffffffffffedd8);
    iVar2 = get_skill(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeecc);
    iVar2 = (int)((double)iVar2 * 0.8);
    if (iVar2 == 0) {
      iVar2 = 0x32;
    }
    for (local_20 = in_RDI->in_room->people; local_20 != (CHAR_DATA *)0x0;
        local_20 = local_20->next_in_room) {
      if (((local_20 != in_RDI) &&
          (bVar1 = is_safe_new(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
                               (bool)in_stack_ffffffffffffedef), !bVar1)) &&
         (iVar3 = number_percent(), 0x5e < iVar3)) {
        for (local_18 = local_20->carrying; local_18 != (OBJ_DATA *)0x0;
            local_18 = local_18->next_content) {
          if (((local_18->wear_loc == -1) &&
              (bVar1 = can_see_obj(in_stack_ffffffffffffee08,in_stack_ffffffffffffee00), bVar1)) &&
             (iVar3 = number_percent(), 0x5e < iVar3)) {
            act((char *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,
                (void *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),ch_00,0);
            iVar3 = number_percent();
            if (iVar3 <= iVar2) {
              obj_from_char((OBJ_DATA *)in_stack_ffffffffffffedf0);
              obj_to_char((OBJ_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),ch_00);
              act((char *)in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,
                  (void *)CONCAT44(iVar2,in_stack_ffffffffffffedd0),ch_00,0);
              return;
            }
            sprintf(&stack0xffffffffffffedd8,"%s tried to steal from me!",in_RDI->name);
            do_myell(in_stack_ffffffffffffede0,(char *)in_stack_ffffffffffffedd8,
                     (CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedd0));
            bVar1 = is_npc(ch_00);
            if (!bVar1) {
              return;
            }
            multi_hit(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff4)
            ;
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void lust_pulse(CHAR_DATA *ch, AFFECT_DATA *af)
{
	OBJ_DATA *steal;
	CHAR_DATA *victim;
	char buf[MSL];
	int skill;

	if (ch->fighting || !is_awake(ch))
		return;

	skill = (int)(get_skill(ch, skill_lookup("steal")) * 0.8);

	if (skill == 0)
		skill = 50;

	for (victim = ch->in_room->people; victim; victim = victim->next_in_room)
	{
		if ((victim == ch) || (is_safe_new(victim, ch, false)) || number_percent() < 95)
			continue;

		for (steal = victim->carrying; steal; steal = steal->next_content)
		{
			if (steal->wear_loc != WEAR_NONE || !can_see_obj(ch, steal) || number_percent() < 95)
				continue;

			act("Overcome by greed, you suddenly reach for $N's pack!", ch, 0, victim, TO_CHAR);

			if (number_percent() > skill)
			{
				sprintf(buf, "%s tried to steal from me!", ch->name);
				do_myell(victim, buf, ch);

				if (is_npc(victim))
					multi_hit(victim, ch, TYPE_UNDEFINED);
			}
			else
			{
				obj_from_char(steal);
				obj_to_char(steal, ch);
				act("You carefully slip $p away from $N.", ch, steal, victim, TO_CHAR);
			}

			return;
		}
	}
}